

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void row_mt_sync_mem_alloc(AV1EncRowMultiThreadSync *row_mt_sync,AV1_COMMON *cm,int rows)

{
  void *pvVar1;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int i;
  int local_18;
  
  pvVar1 = aom_malloc(0x242830);
  *in_RDI = (long)pvVar1;
  if (*in_RDI == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate row_mt_sync->mutex_");
  }
  if (*in_RDI != 0) {
    for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
      pthread_mutex_init((pthread_mutex_t *)(*in_RDI + (long)local_18 * 0x28),
                         (pthread_mutexattr_t *)0x0);
    }
  }
  pvVar1 = aom_malloc(0x2428b8);
  in_RDI[1] = (long)pvVar1;
  if (in_RDI[1] == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate row_mt_sync->cond_");
  }
  if (in_RDI[1] != 0) {
    for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
      pthread_cond_init((pthread_cond_t *)(in_RDI[1] + (long)local_18 * 0x30),
                        (pthread_condattr_t *)0x0);
    }
  }
  pvVar1 = aom_malloc(0x242944);
  in_RDI[2] = (long)pvVar1;
  if (in_RDI[2] == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate row_mt_sync->num_finished_cols");
  }
  *(int *)(in_RDI + 4) = in_EDX;
  *(undefined4 *)(in_RDI + 3) = 1;
  return;
}

Assistant:

static void row_mt_sync_mem_alloc(AV1EncRowMultiThreadSync *row_mt_sync,
                                  AV1_COMMON *cm, int rows) {
#if CONFIG_MULTITHREAD
  int i;

  CHECK_MEM_ERROR(cm, row_mt_sync->mutex_,
                  aom_malloc(sizeof(*row_mt_sync->mutex_) * rows));
  if (row_mt_sync->mutex_) {
    for (i = 0; i < rows; ++i) {
      pthread_mutex_init(&row_mt_sync->mutex_[i], NULL);
    }
  }

  CHECK_MEM_ERROR(cm, row_mt_sync->cond_,
                  aom_malloc(sizeof(*row_mt_sync->cond_) * rows));
  if (row_mt_sync->cond_) {
    for (i = 0; i < rows; ++i) {
      pthread_cond_init(&row_mt_sync->cond_[i], NULL);
    }
  }
#endif  // CONFIG_MULTITHREAD

  CHECK_MEM_ERROR(cm, row_mt_sync->num_finished_cols,
                  aom_malloc(sizeof(*row_mt_sync->num_finished_cols) * rows));

  row_mt_sync->rows = rows;
  // Set up nsync.
  row_mt_sync->sync_range = 1;
}